

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int get_twopass_worst_quality
              (AV1_COMP *cpi,double av_frame_err,double inactive_zone,int av_target_bandwidth)

{
  aom_bit_depth_t bit_depth;
  AV1_PRIMARY *pAVar1;
  double dVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int low;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (av_target_bandwidth < 1) {
    iVar10 = (cpi->rc).worst_quality;
  }
  else {
    dVar11 = 0.9999;
    if (inactive_zone <= 0.9999) {
      dVar11 = inactive_zone;
    }
    piVar3 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar3 = &(cpi->common).mi_params.MBs;
    }
    dVar11 = (double)(~-(ulong)(inactive_zone < 0.0) & (ulong)dVar11);
    uVar6 = *piVar3 - (int)((double)*piVar3 * dVar11);
    uVar7 = 1;
    if (1 < (int)uVar6) {
      uVar7 = (ulong)uVar6;
    }
    iVar10 = (cpi->oxcf).rc_cfg.under_shoot_pct;
    iVar8 = (cpi->oxcf).rc_cfg.over_shoot_pct;
    if (iVar10 < iVar8) {
      iVar8 = iVar10;
    }
    if ((int)uVar6 < 500) {
      dVar13 = 0.925;
    }
    else {
      dVar13 = *(double *)(&DAT_00504ac0 + (ulong)(3000 < (int)uVar6) * 8);
    }
    dVar15 = (double)(100 - iVar8) / 200.0;
    pAVar1 = cpi->ppi;
    dVar14 = 0.2;
    if (0.2 <= dVar15) {
      dVar14 = dVar15;
    }
    dVar15 = 1.0 - dVar14;
    dVar14 = dVar14 + 1.0;
    iVar10 = (pAVar1->p_rc).rate_error_estimate;
    iVar8 = (pAVar1->twopass).rolling_arf_group_target_bits;
    dVar16 = 1.0;
    if ((0 < iVar8 && 0 < (pAVar1->p_rc).total_actual_bits) && (pAVar1->p_rc).bits_off_target != 0)
    {
      dVar16 = (double)(pAVar1->twopass).rolling_arf_group_actual_bits;
      dVar17 = (double)iVar8;
      if (dVar16 <= dVar17) {
        dVar16 = 1.0 - (dVar17 - dVar16) / dVar17;
      }
      else {
        dVar17 = (dVar16 - dVar17) / dVar17;
        dVar16 = 1.0;
        if (dVar17 <= 1.0) {
          dVar16 = dVar17;
        }
        dVar16 = dVar16 + 1.0;
      }
      dVar17 = dVar14;
      if (dVar16 <= dVar14) {
        dVar17 = dVar16;
      }
      dVar16 = dVar15;
      if (dVar15 <= dVar17) {
        dVar16 = dVar17;
      }
    }
    iVar8 = (cpi->oxcf).speed;
    if ((dVar16 < 1.0 && -1 < iVar10) || (iVar10 < 1 && 1.0 < dVar16)) {
      dVar16 = dVar16 * (pAVar1->twopass).bpm_factor;
      if (dVar16 <= dVar14) {
        dVar14 = dVar16;
      }
      if (dVar15 <= dVar14) {
        dVar15 = dVar14;
      }
      (pAVar1->twopass).bpm_factor = dVar15;
    }
    iVar9 = (cpi->rc).best_quality;
    iVar10 = (cpi->rc).worst_quality;
    if (iVar9 < iVar10) {
      dVar15 = (double)iVar8 * 0.005 + 0.975;
      dVar14 = 1.02;
      if (dVar15 <= 1.02) {
        dVar14 = dVar15;
      }
      bit_depth = ((cpi->common).seq_params)->bit_depth;
      dVar15 = (pAVar1->twopass).bpm_factor;
      do {
        iVar8 = iVar9 + iVar10 >> 1;
        lVar4 = (long)(iVar9 + iVar10 >> 5);
        dVar16 = q_div_term[lVar4];
        dVar17 = q_div_term[lVar4 + 1];
        dVar2 = pow(av_frame_err / (1.0 - dVar11),0.9);
        dVar12 = av1_convert_qindex_to_q(iVar8,bit_depth);
        dVar12 = (((dVar2 * 1250000.0) /
                  ((double)(iVar8 % 0x10) * (dVar17 - dVar16) * 0.0625 + dVar16)) *
                 dVar13 * dVar14 * dVar15) / dVar12;
        uVar5 = (ulong)dVar12;
        if (((ulong)(uint)av_target_bandwidth << 9) / uVar7 <
            ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5)) {
          iVar9 = iVar8 + 1;
          iVar8 = iVar10;
        }
        iVar10 = iVar8;
      } while (iVar9 < iVar10);
    }
    iVar10 = iVar9;
    if (((cpi->oxcf).rc_cfg.mode == AOM_CQ) &&
       (iVar10 = (cpi->oxcf).rc_cfg.cq_level, iVar10 < iVar9)) {
      iVar10 = iVar9;
    }
  }
  return iVar10;
}

Assistant:

static int get_twopass_worst_quality(AV1_COMP *cpi, const double av_frame_err,
                                     double inactive_zone,
                                     int av_target_bandwidth) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  inactive_zone = fclamp(inactive_zone, 0.0, 0.9999);

  if (av_target_bandwidth <= 0) {
    return rc->worst_quality;  // Highest value allowed
  } else {
    const int num_mbs = (oxcf->resize_cfg.resize_mode != RESIZE_NONE)
                            ? cpi->initial_mbs
                            : cpi->common.mi_params.MBs;
    const int active_mbs = AOMMAX(1, num_mbs - (int)(num_mbs * inactive_zone));
    const double av_err_per_mb = av_frame_err / (1.0 - inactive_zone);
    const uint64_t target_norm_bits_per_mb =
        ((uint64_t)av_target_bandwidth << BPER_MB_NORMBITS) / active_mbs;
    int rate_err_tol = AOMMIN(rc_cfg->under_shoot_pct, rc_cfg->over_shoot_pct);
    const double size_factor =
        (active_mbs < 500) ? 0.925 : ((active_mbs > 3000) ? 1.05 : 1.0);
    const double speed_factor =
        AOMMIN(1.02, (0.975 + (0.005 * cpi->oxcf.speed)));

    // Update bpm correction factor based on previous GOP rate error.
    twopass_update_bpm_factor(cpi, rate_err_tol);

    // Try and pick a max Q that will be high enough to encode the
    // content at the given rate.
    int q = find_qindex_by_rate_with_correction(
        target_norm_bits_per_mb, cpi->common.seq_params->bit_depth,
        av_err_per_mb,
        cpi->ppi->twopass.bpm_factor * speed_factor * size_factor,
        rc->best_quality, rc->worst_quality);

    // Restriction on active max q for constrained quality mode.
    if (rc_cfg->mode == AOM_CQ) q = AOMMAX(q, rc_cfg->cq_level);
    return q;
  }
}